

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O3

Summary * __thiscall
prometheus::Family<prometheus::Summary>::Add
          (Family<prometheus::Summary> *this,Labels *labels,
          unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_> *object)

{
  unordered_map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_>,_prometheus::detail::LabelHasher,_std::equal_to<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_>_>_>_>
  *this_00;
  Summary *pSVar1;
  bool bVar2;
  int iVar3;
  const_iterator __it;
  const_iterator cVar4;
  _Rb_tree_node_base *p_Var5;
  invalid_argument *this_01;
  _Rb_tree_header *p_Var6;
  pair<std::__detail::_Node_iterator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_>_>,_false,_true>,_bool>
  pVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  Summary *local_38;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar3 == 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_68,&labels->_M_t);
    this_00 = &this->metrics_;
    local_38 = (object->_M_t).
               super___uniq_ptr_impl<prometheus::Summary,_std::default_delete<prometheus::Summary>_>
               ._M_t.
               super__Tuple_impl<0UL,_prometheus::Summary_*,_std::default_delete<prometheus::Summary>_>
               .super__Head_base<0UL,_prometheus::Summary_*,_false>._M_head_impl;
    (object->_M_t).
    super___uniq_ptr_impl<prometheus::Summary,_std::default_delete<prometheus::Summary>_>._M_t.
    super__Tuple_impl<0UL,_prometheus::Summary_*,_std::default_delete<prometheus::Summary>_>.
    super__Head_base<0UL,_prometheus::Summary_*,_false>._M_head_impl = (Summary *)0x0;
    pVar7 = std::
            _Hashtable<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,std::unique_ptr<prometheus::Summary,std::default_delete<prometheus::Summary>>>,std::allocator<std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,std::unique_ptr<prometheus::Summary,std::default_delete<prometheus::Summary>>>>,std::__detail::_Select1st,std::equal_to<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,prometheus::detail::LabelHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::unique_ptr<prometheus::Summary,std::default_delete<prometheus::Summary>>>>
                      ((_Hashtable<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,std::unique_ptr<prometheus::Summary,std::default_delete<prometheus::Summary>>>,std::allocator<std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,std::unique_ptr<prometheus::Summary,std::default_delete<prometheus::Summary>>>>,std::__detail::_Select1st,std::equal_to<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,prometheus::detail::LabelHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this_00);
    __it.
    super__Node_iterator_base<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_>_>,_true>
               )pVar7.first.
                super__Node_iterator_base<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_>_>,_true>
                ._M_cur;
    if (local_38 != (Summary *)0x0) {
      std::default_delete<prometheus::Summary>::operator()
                ((default_delete<prometheus::Summary> *)&local_38,local_38);
    }
    local_38 = (Summary *)0x0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_68);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      p_Var5 = (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var6 = &(labels->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var5 != p_Var6) {
        do {
          bVar2 = CheckLabelName((string *)(p_Var5 + 1),Summary);
          if (!bVar2) {
            std::_Hashtable<$670374b0$>::erase(&this_00->_M_h,__it);
            this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this_01,"Invalid label name");
LAB_001210e2:
            __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&(this->constant_labels_)._M_t,(key_type *)(p_Var5 + 1));
          if ((_Rb_tree_header *)cVar4._M_node !=
              &(this->constant_labels_)._M_t._M_impl.super__Rb_tree_header) {
            std::_Hashtable<$670374b0$>::erase(&this_00->_M_h,__it);
            this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this_01,"Duplicate label name");
            goto LAB_001210e2;
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var6);
      }
    }
    pSVar1 = *(Summary **)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_>_>,_true>
                     ._M_cur + 0x38);
    if (pSVar1 != (Summary *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
      return pSVar1;
    }
  }
  else {
    std::__throw_system_error(iVar3);
  }
  __assert_fail("stored_object",
                "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/src/family.cc"
                ,0x38,
                "T &prometheus::Family<prometheus::Summary>::Add(const Labels &, std::unique_ptr<T>) [T = prometheus::Summary]"
               );
}

Assistant:

T& Family<T>::Add(const Labels& labels, std::unique_ptr<T> object) {
  std::lock_guard<std::mutex> lock{mutex_};

  auto insert_result =
      metrics_.insert(std::make_pair(labels, std::move(object)));

  if (insert_result.second) {
    // insertion took place, retroactively check for unlikely issues
    for (auto& label_pair : labels) {
      const auto& label_name = label_pair.first;
      if (!CheckLabelName(label_name, T::metric_type)) {
        metrics_.erase(insert_result.first);
        throw std::invalid_argument("Invalid label name");
      }
      if (constant_labels_.count(label_name)) {
        metrics_.erase(insert_result.first);
        throw std::invalid_argument("Duplicate label name");
      }
    }
  }

  auto& stored_object = insert_result.first->second;
  assert(stored_object);
  return *stored_object;
}